

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::setRootIndex(QAbstractItemView *this,QModelIndex *index)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  QAccessibleTableModelChangeEvent accessibleEvent;
  code *local_58;
  undefined8 uStack_50;
  QAbstractItemView *local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) ||
     ((index->m).ptr == *(QAbstractItemModel **)(lVar1 + 0x2f8))) {
    QPersistentModelIndex::operator=((QPersistentModelIndex *)(lVar1 + 0x3b8),index);
    cVar2 = QAccessible::isActive();
    if (cVar2 != '\0') {
      uStack_40 = 0xffffffff;
      local_58 = QIcon::QIcon;
      local_38 = 0xffffffff;
      uStack_34 = 0xffffffff;
      uStack_30 = 0xffffffff;
      uStack_2c = 0xffffffff;
      uStack_50 = 0xaaaaaaaa00000116;
      local_48 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)&local_58);
    }
    if (*(char *)(lVar1 + 0x492) == '\0') {
      *(undefined1 *)(lVar1 + 0x492) = 1;
      QBasicTimer::start(lVar1 + 0x538,0,1,*(undefined8 *)(lVar1 + 8));
    }
    if ((*(int *)(lVar1 + 0x2ac) != 0) &&
       ((*(int *)(lVar1 + 0x2ac) == 2 || (*(char *)(lVar1 + 0x2a0) == '\0')))) {
      QWidget::updateGeometry(*(QWidget **)(lVar1 + 8));
    }
  }
  else {
    setRootIndex();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setRootIndex(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (Q_UNLIKELY(index.isValid() && index.model() != d->model)) {
        qWarning("QAbstractItemView::setRootIndex failed : index must be from the currently set model");
        return;
    }
    d->root = index;
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->doDelayedItemsLayout();
    d->updateGeometry();
}